

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  pointer ppVar5;
  LogMessage *pLVar6;
  undefined8 uVar7;
  byte local_cb;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  _Self local_40;
  _Self local_38;
  const_iterator iter;
  MessageFactory *factory_local;
  Descriptor *message_type_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)factory;
  message_type_local._4_4_ = number;
  pEStack_18 = this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type *)((long)&message_type_local + 4));
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar2 = std::operator==(&local_38,&local_40);
  local_cb = 1;
  if (!bVar2) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_38);
    local_cb = (ppVar5->second).field_0xa & 0xf;
  }
  if ((local_cb & 1) == 0) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_38);
    iVar3 = 1;
    if (((ppVar5->second).is_repeated & 1U) != 0) {
      iVar3 = 3;
    }
    local_79 = 0;
    if (iVar3 != 1) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      local_79 = 1;
      pLVar6 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: ((iter->second).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(local_8d,pLVar6);
    }
    if ((local_79 & 1) != 0) {
      LogMessage::~LogMessage(&local_78);
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_38);
    CVar4 = cpp_type((ppVar5->second).type);
    local_c9 = 0;
    if (CVar4 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      local_c9 = 1;
      pLVar6 = LogMessage::operator<<
                         (&local_c8,
                          "CHECK failed: (cpp_type((iter->second).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_ca,pLVar6);
    }
    if ((local_c9 & 1) != 0) {
      LogMessage::~LogMessage(&local_c8);
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_38);
    if (((byte)(ppVar5->second).field_0xa >> 4 & 1) == 0) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_38);
      this_local = (ExtensionSet *)(ppVar5->second).field_0.string_value;
    }
    else {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_38);
      pRVar1 = (ppVar5->second).field_0.repeated_string_value;
      uVar7 = (**(code **)(*(long *)iter._M_node + 0x10))(iter._M_node,message_type);
      this_local = (ExtensionSet *)
                   (**(code **)((pRVar1->super_RepeatedPtrFieldBase).arena_ + 0x18))(pRVar1,uVar7);
    }
  }
  else {
    this_local = (ExtensionSet *)
                 (**(code **)(*(long *)iter._M_node + 0x10))(iter._M_node,message_type);
  }
  return (MessageLite *)this_local;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end() || iter->second.is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    if (iter->second.is_lazy) {
      return iter->second.lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type));
    } else {
      return *iter->second.message_value;
    }
  }
}